

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

CURLcode Curl_req_done(SingleRequest *req,Curl_easy *data,_Bool aborted)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,aborted) == 0) {
    req_flush(data);
  }
  Curl_client_reset(data);
  Curl_doh_close(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_req_done(struct SingleRequest *req,
                       struct Curl_easy *data, bool aborted)
{
  (void)req;
  if(!aborted)
    (void)req_flush(data);
  Curl_client_reset(data);
#ifndef CURL_DISABLE_DOH
  Curl_doh_close(data);
#endif
  return CURLE_OK;
}